

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setDepthMode(GLEngine *this,DepthMode newMode)

{
  PFNGLDISABLEPROC *pp_Var1;
  GLenum GVar2;
  GLboolean GVar3;
  
  GVar3 = '\x01';
  switch(newMode) {
  case Less:
    GVar2 = 0x201;
    break;
  case LEqual:
    GVar2 = 0x203;
    break;
  case LEqualReadOnly:
    GVar2 = 0x203;
    GVar3 = '\0';
    break;
  case Greater:
    GVar2 = 0x204;
    break;
  case Disable:
    pp_Var1 = &glad_glDisable;
    GVar2 = 0xb71;
    GVar3 = '\0';
    goto LAB_0020ce4c;
  default:
    return;
  }
  (*glad_glEnable)(0xb71);
  pp_Var1 = &glad_glDepthFunc;
LAB_0020ce4c:
  (**pp_Var1)(GVar2);
  (*glad_glDepthMask)(GVar3);
  return;
}

Assistant:

void GLEngine::setDepthMode(DepthMode newMode) {
  switch (newMode) {
  case DepthMode::Less:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LESS);
    glDepthMask(GL_TRUE);
    break;
  case DepthMode::LEqual:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LEQUAL);
    glDepthMask(GL_TRUE);
    break;
  case DepthMode::LEqualReadOnly:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LEQUAL);
    glDepthMask(GL_FALSE);
    break;
  case DepthMode::Greater:
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_GREATER);
    glDepthMask(GL_TRUE);
    break;
  case DepthMode::Disable:
    glDisable(GL_DEPTH_TEST);
    glDepthMask(GL_FALSE); // doesn't actually matter
    break;
  }
}